

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

uint32_t Function_Pool::Sum(Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height)

{
  uint32_t uVar1;
  FunctionTask *this;
  uint32_t in_stack_fffffffffffffe98;
  uint32_t in_stack_fffffffffffffe9c;
  uint32_t in_stack_fffffffffffffea0;
  uint32_t in_stack_fffffffffffffea4;
  Image *in_stack_fffffffffffffea8;
  __atomic_base<unsigned_long> in_stack_fffffffffffffeb0;
  
  this = (FunctionTask *)&stack0xfffffffffffffea8;
  FunctionTask::FunctionTask
            ((FunctionTask *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  uVar1 = FunctionTask::Sum((FunctionTask *)in_stack_fffffffffffffeb0._M_i,in_stack_fffffffffffffea8
                            ,in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,
                            in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
  FunctionTask::~FunctionTask(this);
  return uVar1;
}

Assistant:

uint32_t Sum( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height )
    {
        return FunctionTask().Sum( image, x, y, width, height );
    }